

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<unsigned_long&,char_const(&)[2],unsigned_long&>
          (String *__return_storage_ptr__,kj *this,unsigned_long *params,char (*params_1) [2],
          unsigned_long *params_2)

{
  ArrayPtr<const_char> local_88;
  CappedArray<char,_26UL> local_78;
  CappedArray<char,_26UL> local_50;
  
  toCharSequence<unsigned_long&>(&local_50,this,params);
  local_88 = toCharSequence<char_const(&)[2]>((char (*) [2])params);
  toCharSequence<unsigned_long&>(&local_78,(kj *)params_1,(unsigned_long *)local_88.size_);
  _::concat<kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>>
            (__return_storage_ptr__,(_ *)&local_50,(CappedArray<char,_26UL> *)&local_88,
             (ArrayPtr<const_char> *)&local_78,(CappedArray<char,_26UL> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}